

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall enact::Lexer::scanToken(Token *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  bool bVar2;
  TokenType type;
  allocator<char> local_41;
  string errorMessage;
  
  skipWhitespace(this);
  this->m_start = this->m_current;
  if (this->m_current < (this->m_source)._M_string_length) {
    bVar1 = advance(this);
    if ((byte)(bVar1 - 0x30) < 10) {
      number(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      identifier(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    switch(bVar1) {
    case 0x21:
      bVar2 = match(this,'=');
      type = bVar2 | BANG;
      break;
    case 0x22:
      string(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x23:
      type = HASH;
      break;
    case 0x24:
      type = DOLLAR;
      break;
    case 0x25:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
switchD_00111597_caseD_25:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&errorMessage,"Unrecognized character \'",&local_41);
      std::__cxx11::string::push_back((char)&errorMessage);
      std::__cxx11::string::append((char *)&errorMessage);
      errorToken(__return_storage_ptr__,this,&errorMessage);
      std::__cxx11::string::~string((string *)&errorMessage);
      return __return_storage_ptr__;
    case 0x26:
      type = AMPERSAND;
      break;
    case 0x27:
      type = APOSTROPHE;
      break;
    case 0x28:
      type = LEFT_PAREN;
      break;
    case 0x29:
      if (0 < this->m_currentInterpolations) {
        interpolationEnd(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      type = RIGHT_PAREN;
      break;
    case 0x2a:
      type = STAR;
      break;
    case 0x2b:
      type = PLUS;
      break;
    case 0x2c:
      type = COMMA;
      break;
    case 0x2d:
      type = MINUS;
      break;
    case 0x2e:
      bVar2 = match(this,'.');
      if (bVar2) {
        bVar2 = match(this,'.');
        if (bVar2) {
          type = DOT_DOT_DOT;
        }
        else {
          type = DOT_DOT;
        }
      }
      else {
        type = DOT;
      }
      break;
    case 0x2f:
      type = SLASH;
      break;
    case 0x3b:
      type = SEMICOLON;
      break;
    case 0x3c:
      bVar2 = match(this,'=');
      if (bVar2) {
        type = LESS_EQUAL;
      }
      else {
        bVar2 = match(this,'<');
        if (bVar2) {
          type = LESS_LESS;
        }
        else {
          type = LESS;
        }
      }
      break;
    case 0x3d:
      bVar2 = match(this,'=');
      if (bVar2) {
        type = EQUAL_EQUAL;
      }
      else {
        bVar2 = match(this,'>');
        if (bVar2) {
          type = EQUAL_GREATER;
        }
        else {
          type = EQUAL;
        }
      }
      break;
    case 0x3e:
      bVar2 = match(this,'=');
      if (bVar2) {
        type = GREATER_EQUAL;
      }
      else {
        bVar2 = match(this,'>');
        if (bVar2) {
          type = GREATER_GREATER;
        }
        else {
          type = GREATER;
        }
      }
      break;
    case 0x3f:
      type = QUESTION;
      break;
    default:
      switch(bVar1) {
      case 0x7b:
        type = LEFT_BRACE;
        break;
      case 0x7c:
        type = PIPE;
        break;
      case 0x7d:
        type = RIGHT_BRACE;
        break;
      case 0x7e:
        type = TILDE;
        break;
      default:
        if (bVar1 == 0x5b) {
          type = LEFT_SQUARE;
        }
        else if (bVar1 == 0x5d) {
          type = RIGHT_SQUARE;
        }
        else {
          if (bVar1 != 0x5e) goto switchD_00111597_caseD_25;
          type = CARAT;
        }
      }
    }
  }
  else {
    type = END_OF_FILE;
  }
  makeToken(__return_storage_ptr__,this,type);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::scanToken() {
        skipWhitespace();
        m_start = m_current;

        if (isAtEnd()) return makeToken(TokenType::END_OF_FILE);

        char c = advance();

        if (isDigit(c)) return number();
        if (isIdentifierStart(c)) return identifier();

        switch (c) {
            // Single character tokens.
            case '(':
                return makeToken(TokenType::LEFT_PAREN);
            case ')':
                if (m_currentInterpolations > 0) {
                    return interpolationEnd();
                }
                return makeToken(TokenType::RIGHT_PAREN);
            case '{':
                return makeToken(TokenType::LEFT_BRACE);
            case '}':
                return makeToken(TokenType::RIGHT_BRACE);
            case '[':
                return makeToken(TokenType::LEFT_SQUARE);
            case ']':
                return makeToken(TokenType::RIGHT_SQUARE);
            case '&':
                return makeToken(TokenType::AMPERSAND);
            case '\'':
                return makeToken(TokenType::APOSTROPHE);
            case '^':
                return makeToken(TokenType::CARAT);
            case ',':
                return makeToken(TokenType::COMMA);
            case '$':
                return makeToken(TokenType::DOLLAR);
            case '#':
                return makeToken(TokenType::HASH);
            case '-':
                return makeToken(TokenType::MINUS);
            case '|':
                return makeToken(TokenType::PIPE);
            case '+':
                return makeToken(TokenType::PLUS);
            case '?':
                return makeToken(TokenType::QUESTION);
            case ';':
                return makeToken(TokenType::SEMICOLON);
            case '/':
                return makeToken(TokenType::SLASH);
            case '*':
                return makeToken(TokenType::STAR);
            case '~':
                return makeToken(TokenType::TILDE);

            // 1 or 2 character tokens.
            case '!':
                return makeToken(match('=') ? TokenType::BANG_EQUAL : TokenType::BANG);
            case '=':
                if (match('=')) {
                    return makeToken(TokenType::EQUAL_EQUAL);
                }
                if (match('>')) {
                    return makeToken(TokenType::EQUAL_GREATER);
                }
                return makeToken(TokenType::EQUAL);
            case '>':
                if (match('=')) {
                    return makeToken(TokenType::GREATER_EQUAL);
                }
                if (match('>')) {
                    return makeToken(TokenType::GREATER_GREATER);
                }
                return makeToken(TokenType::GREATER);
            case '<':
                if (match('=')) {
                    return makeToken(TokenType::LESS_EQUAL);
                }
                if (match('<')) {
                    return makeToken(TokenType::LESS_LESS);
                }
                return makeToken(TokenType::LESS);

            // 1, 2 or 3 character tokens.
            case '.':
                if (match('.')) {
                    if (match('.')) {
                        return makeToken(TokenType::DOT_DOT_DOT);
                    }
                    return makeToken(TokenType::DOT_DOT);
                }
                return makeToken(TokenType::DOT);

            case '"':
                return string();
        }

        std::string errorMessage = "Unrecognized character '";
        errorMessage.push_back(c);
        errorMessage.append("'.");
        return errorToken(errorMessage);
    }